

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O1

int If_CutSopBalanceEvalInt
              (Vec_Int_t *vCover,int *pTimes,int *pFaninLits,Vec_Int_t *vAig,int *piRes,int nSuppAll
              ,int *pArea)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  int fXor;
  int *piVar7;
  int nCounterAnd;
  int nCounterOr;
  int pFaninLitsAnd [15];
  int pCounterAnd [15];
  int pFaninLitsOr [70];
  int pCounterOr [70];
  int in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd8;
  int local_324;
  int local_320;
  uint local_31c;
  Vec_Int_t *local_318;
  int *local_310;
  int *local_308;
  uint *local_300;
  long local_2f8;
  long local_2f0;
  int local_2e8 [16];
  int local_2a8 [16];
  int local_268 [72];
  int local_148 [70];
  
  iVar2 = -1;
  if (vCover->nSize < 0x47) {
    local_320 = 0;
    iVar3 = vCover->nSize;
    piVar7 = piRes;
    local_310 = pFaninLits;
    local_308 = pTimes;
    if (iVar3 < 1) {
      iVar2 = 0;
    }
    else {
      local_2f0 = (ulong)(uint)nSuppAll * 2;
      lVar5 = 0;
      uVar1 = 0;
      iVar2 = 0;
      local_318 = vCover;
      local_300 = (uint *)piRes;
      do {
        fXor = (int)piVar7;
        iVar3 = vCover->pArray[lVar5];
        local_324 = 0;
        local_31c = uVar1;
        local_2f8 = lVar5;
        if (nSuppAll < 1) {
          iVar6 = 0;
        }
        else {
          lVar5 = 0;
          iVar6 = 0;
          do {
            switch(iVar3 >> ((byte)lVar5 & 0x1f) & 3) {
            case 0:
              goto switchD_0041c53c_caseD_0;
            case 1:
              iVar2 = *(int *)((long)local_308 + lVar5 * 2);
              if (vAig == (Vec_Int_t *)0x0) {
                piVar7 = (int *)0xffffffff;
              }
              else {
                uVar1 = *(uint *)((long)local_310 + lVar5 * 2);
                if ((int)uVar1 < 0) goto LAB_0041c6fd;
                piVar7 = (int *)(ulong)(uVar1 ^ 1);
              }
              break;
            case 2:
              if (vAig == (Vec_Int_t *)0x0) {
                piVar7 = (int *)0xffffffff;
              }
              else {
                piVar7 = (int *)(ulong)*(uint *)((long)local_310 + lVar5 * 2);
              }
              iVar2 = *(int *)((long)local_308 + lVar5 * 2);
              break;
            case 3:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                            ,0xd3,
                            "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                           );
            }
            iVar6 = iVar6 + 1;
            iVar2 = If_LogCounterAddAig(local_2a8,&local_324,local_2e8,iVar2,(int)piVar7,vAig,
                                        nSuppAll,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcd8
                                       );
switchD_0041c53c_caseD_0:
            fXor = (int)piVar7;
            lVar5 = lVar5 + 2;
          } while (local_2f0 != lVar5);
        }
        if (local_324 < 1) {
          __assert_fail("nCounterAnd > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                        ,0xd5,
                        "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                       );
        }
        if (iVar6 < 1) {
          __assert_fail("nLits > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                        ,0xd6,
                        "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                       );
        }
        if (vAig == (Vec_Int_t *)0x0) {
          *pArea = *pArea + iVar6 + -1;
          piVar7 = (int *)0xffffffff;
          uVar1 = local_31c;
        }
        else {
          uVar1 = If_LogCreateAndXorMulti(vAig,local_2e8,local_324,nSuppAll,fXor);
          if ((int)uVar1 < 0) goto LAB_0041c6fd;
          piVar7 = (int *)(ulong)(uVar1 ^ 1);
        }
        vCover = local_318;
        iVar2 = If_LogCounterAddAig(local_148,&local_320,local_268,iVar2,(int)piVar7,vAig,nSuppAll,
                                    in_stack_fffffffffffffcd0,in_stack_fffffffffffffcd8);
        lVar5 = local_2f8 + 1;
        iVar3 = vCover->nSize;
        piRes = (int *)local_300;
      } while (lVar5 < iVar3);
    }
    if (local_320 < 1) {
      __assert_fail("nCounterOr > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                    ,0xdd,
                    "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                   );
    }
    if (vAig == (Vec_Int_t *)0x0) {
      *pArea = iVar3 + *pArea + -1;
    }
    else {
      uVar1 = If_LogCreateAndXorMulti(vAig,local_268,local_320,nSuppAll,(int)piVar7);
      if ((int)uVar1 < 0) {
LAB_0041c6fd:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      *piRes = uVar1 ^ 1;
      uVar4 = uVar1 ^ 1;
      if (((uint)vCover->nCap >> 0x10 & 1) != 0) {
        uVar4 = uVar1;
      }
      *piRes = uVar4;
    }
  }
  return iVar2;
}

Assistant:

int If_CutSopBalanceEvalInt( Vec_Int_t * vCover, int * pTimes, int * pFaninLits, Vec_Int_t * vAig, int * piRes, int nSuppAll, int * pArea )
{
    int nCounterAnd, pCounterAnd[IF_MAX_FUNC_LUTSIZE], pFaninLitsAnd[IF_MAX_FUNC_LUTSIZE];
    int nCounterOr,  pCounterOr[IF_MAX_CUBES],  pFaninLitsOr[IF_MAX_CUBES];
    int i, k, Entry, Literal, nLits, Delay = 0, iRes = 0;
    if ( Vec_IntSize(vCover) > IF_MAX_CUBES )
        return -1;
    nCounterOr = 0;
    Vec_IntForEachEntry( vCover, Entry, i )
    { 
        nCounterAnd = nLits = 0;
        for ( k = 0; k < nSuppAll; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 ) // neg literal
                nLits++, Delay = If_LogCounterAddAig( pCounterAnd, &nCounterAnd, pFaninLitsAnd, pTimes[k], vAig ? Abc_LitNot(pFaninLits[k]) : -1, vAig, nSuppAll, 0, 0 );
            else if ( Literal == 2 ) // pos literal
                nLits++, Delay = If_LogCounterAddAig( pCounterAnd, &nCounterAnd, pFaninLitsAnd, pTimes[k], vAig ? pFaninLits[k] : -1, vAig, nSuppAll, 0, 0 );
            else if ( Literal != 0 ) 
                assert( 0 );
        }
        assert( nCounterAnd > 0 );
        assert( nLits > 0 );
        if ( vAig )
            iRes = If_LogCreateAndXorMulti( vAig, pFaninLitsAnd, nCounterAnd, nSuppAll, 0 );
        else
            *pArea += nLits == 1 ? 0 : nLits - 1;
        Delay = If_LogCounterAddAig( pCounterOr, &nCounterOr, pFaninLitsOr, Delay, vAig ? Abc_LitNot(iRes) : -1, vAig, nSuppAll, 0, 0 );
    }
    assert( nCounterOr > 0 );
    if ( vAig )
    {
        *piRes = Abc_LitNot( If_LogCreateAndXorMulti( vAig, pFaninLitsOr, nCounterOr, nSuppAll, 0 ) );
        if ( ((vCover->nCap >> 16) & 1) )  // hack to remember complemented attribute
            *piRes = Abc_LitNot( *piRes );
    }
    else       
        *pArea += Vec_IntSize(vCover) == 1 ? 0 : Vec_IntSize(vCover) - 1;
    return Delay;
}